

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_file.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::FileGenerator::GenerateForwardDeclarations
          (FileGenerator *this,Printer *printer)

{
  bool bVar1;
  ulong uVar2;
  size_type sVar3;
  reference ppFVar4;
  Formatter *this_00;
  Formatter *pFVar5;
  reference ppDVar6;
  size_type sVar7;
  reference ppEVar8;
  long in_RDI;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::cpp::FileGenerator::ForwardDeclarations>
  *pair_1;
  iterator __end3_1;
  iterator __begin3_1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::cpp::FileGenerator::ForwardDeclarations,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::cpp::FileGenerator::ForwardDeclarations>_>_>
  *__range3_1;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::cpp::FileGenerator::ForwardDeclarations>
  *pair;
  iterator __end3;
  iterator __begin3;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::cpp::FileGenerator::ForwardDeclarations,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::cpp::FileGenerator::ForwardDeclarations>_>_>
  *__range3;
  NamespaceOpener ns;
  EnumDescriptor *d_1;
  int i_2;
  Descriptor *d;
  int i_1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::cpp::FileGenerator::ForwardDeclarations,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::cpp::FileGenerator::ForwardDeclarations>_>_>
  decls;
  unordered_set<const_google::protobuf::FileDescriptor_*,_std::hash<const_google::protobuf::FileDescriptor_*>,_std::equal_to<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  public_set;
  int i;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  fields;
  vector<const_google::protobuf::EnumDescriptor_*,_std::allocator<const_google::protobuf::EnumDescriptor_*>_>
  enums;
  vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
  classes;
  Formatter format;
  Printer *in_stack_fffffffffffffd78;
  Options *in_stack_fffffffffffffd80;
  FileDescriptor *in_stack_fffffffffffffd88;
  undefined7 in_stack_fffffffffffffd90;
  byte in_stack_fffffffffffffd97;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  *in_stack_fffffffffffffd98;
  FileDescriptor *in_stack_fffffffffffffda0;
  unordered_set<const_google::protobuf::FileDescriptor_*,_std::hash<const_google::protobuf::FileDescriptor_*>,_std::equal_to<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  *in_stack_fffffffffffffda8;
  NamespaceOpener *in_stack_fffffffffffffdb0;
  undefined7 in_stack_fffffffffffffdb8;
  byte in_stack_fffffffffffffdbf;
  FileDescriptor *in_stack_fffffffffffffdc0;
  Descriptor *d_00;
  Options *in_stack_fffffffffffffdd0;
  Formatter *in_stack_fffffffffffffdd8;
  ForwardDeclarations *in_stack_fffffffffffffde0;
  string *in_stack_fffffffffffffe08;
  _Self in_stack_fffffffffffffe10;
  _Self local_1e8;
  undefined1 *local_1e0;
  reference local_1d8;
  _Self local_1d0;
  _Self local_1c8;
  Options *options;
  Formatter *in_stack_fffffffffffffe48;
  ForwardDeclarations *in_stack_fffffffffffffe50;
  string local_198 [32];
  FileDescriptor *local_178;
  EnumDescriptor *local_170;
  int local_164;
  string local_160 [32];
  NamespaceOpener *local_140;
  Descriptor *local_138;
  int local_12c;
  undefined1 local_128 [132];
  int local_a4;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  local_a0;
  vector<const_google::protobuf::EnumDescriptor_*,_std::allocator<const_google::protobuf::EnumDescriptor_*>_>
  local_78;
  vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
  local_60 [4];
  
  Formatter::Formatter
            ((Formatter *)in_stack_fffffffffffffd80,in_stack_fffffffffffffd78,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)0x4d1783);
  std::
  vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
  ::vector((vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
            *)0x4d1798);
  std::
  vector<const_google::protobuf::EnumDescriptor_*,_std::allocator<const_google::protobuf::EnumDescriptor_*>_>
  ::vector((vector<const_google::protobuf::EnumDescriptor_*,_std::allocator<const_google::protobuf::EnumDescriptor_*>_>
            *)0x4d17a5);
  FlattenMessagesInFile
            ((FileDescriptor *)in_stack_fffffffffffffd80,
             (vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
              *)in_stack_fffffffffffffd78);
  if ((*(byte *)(in_RDI + 0x71) & 1) != 0) {
    std::
    vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
    ::vector((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              *)0x4d17e4);
    ListAllFields(in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
    for (local_a4 = 0; uVar2 = (ulong)local_a4,
        sVar3 = std::
                vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                ::size(&local_a0), uVar2 < sVar3; local_a4 = local_a4 + 1) {
      ppFVar4 = std::
                vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                ::operator[](&local_a0,(long)local_a4);
      in_stack_fffffffffffffde0 = (ForwardDeclarations *)FieldDescriptor::containing_type(*ppFVar4);
      local_128._120_8_ = in_stack_fffffffffffffde0;
      std::
      vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
      ::push_back((vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
                   *)in_stack_fffffffffffffd80,(value_type *)in_stack_fffffffffffffd78);
      std::
      vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ::operator[](&local_a0,(long)local_a4);
      in_stack_fffffffffffffdd8 =
           (Formatter *)FieldDescriptor::message_type((FieldDescriptor *)in_stack_fffffffffffffd80);
      local_128._112_8_ = in_stack_fffffffffffffdd8;
      std::
      vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
      ::push_back((vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
                   *)in_stack_fffffffffffffd80,(value_type *)in_stack_fffffffffffffd78);
      std::
      vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ::operator[](&local_a0,(long)local_a4);
      in_stack_fffffffffffffdd0 =
           (Options *)FieldDescriptor::enum_type((FieldDescriptor *)in_stack_fffffffffffffd80);
      local_128._104_8_ = in_stack_fffffffffffffdd0;
      std::
      vector<const_google::protobuf::EnumDescriptor_*,_std::allocator<const_google::protobuf::EnumDescriptor_*>_>
      ::push_back((vector<const_google::protobuf::EnumDescriptor_*,_std::allocator<const_google::protobuf::EnumDescriptor_*>_>
                   *)in_stack_fffffffffffffd80,(value_type *)in_stack_fffffffffffffd78);
    }
    ListAllTypesForServices
              (in_stack_fffffffffffffdc0,
               (vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
                *)CONCAT17(in_stack_fffffffffffffdbf,in_stack_fffffffffffffdb8));
    std::
    vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
    ::~vector((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
               *)CONCAT17(in_stack_fffffffffffffd97,in_stack_fffffffffffffd90));
  }
  d_00 = (Descriptor *)(local_128 + 0x30);
  std::
  unordered_set<const_google::protobuf::FileDescriptor_*,_std::hash<const_google::protobuf::FileDescriptor_*>,_std::equal_to<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  ::unordered_set((unordered_set<const_google::protobuf::FileDescriptor_*,_std::hash<const_google::protobuf::FileDescriptor_*>,_std::equal_to<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                   *)0x4d199b);
  PublicImportDFS((FileDescriptor *)in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::cpp::FileGenerator::ForwardDeclarations,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::cpp::FileGenerator::ForwardDeclarations>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::cpp::FileGenerator::ForwardDeclarations,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::cpp::FileGenerator::ForwardDeclarations>_>_>
         *)0x4d19c0);
  local_12c = 0;
  while( true ) {
    this_00 = (Formatter *)(long)local_12c;
    pFVar5 = (Formatter *)
             std::
             vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
             ::size(local_60);
    if (pFVar5 <= this_00) break;
    ppDVar6 = std::
              vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
              ::operator[](local_60,(long)local_12c);
    local_138 = *ppDVar6;
    in_stack_fffffffffffffdbf = 0;
    if (local_138 != (Descriptor *)0x0) {
      in_stack_fffffffffffffdb0 = (NamespaceOpener *)Descriptor::file(local_138);
      local_140 = in_stack_fffffffffffffdb0;
      sVar7 = std::
              unordered_set<const_google::protobuf::FileDescriptor_*,_std::hash<const_google::protobuf::FileDescriptor_*>,_std::equal_to<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
              ::count((unordered_set<const_google::protobuf::FileDescriptor_*,_std::hash<const_google::protobuf::FileDescriptor_*>,_std::equal_to<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                       *)in_stack_fffffffffffffd80,(key_type *)in_stack_fffffffffffffd78);
      in_stack_fffffffffffffdbf = sVar7 != 0 ^ 0xff;
    }
    if ((in_stack_fffffffffffffdbf & 1) != 0) {
      Namespace_abi_cxx11_((Descriptor *)in_stack_fffffffffffffd88,in_stack_fffffffffffffd80);
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::cpp::FileGenerator::ForwardDeclarations,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::cpp::FileGenerator::ForwardDeclarations>_>_>
      ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::cpp::FileGenerator::ForwardDeclarations,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::cpp::FileGenerator::ForwardDeclarations>_>_>
                    *)this_00,
                   (key_type *)CONCAT17(in_stack_fffffffffffffdbf,in_stack_fffffffffffffdb8));
      ForwardDeclarations::AddMessage((ForwardDeclarations *)in_stack_fffffffffffffdd0,d_00);
      std::__cxx11::string::~string(local_160);
    }
    local_12c = local_12c + 1;
  }
  local_164 = 0;
  while( true ) {
    uVar2 = (ulong)local_164;
    sVar3 = std::
            vector<const_google::protobuf::EnumDescriptor_*,_std::allocator<const_google::protobuf::EnumDescriptor_*>_>
            ::size(&local_78);
    if (sVar3 <= uVar2) break;
    ppEVar8 = std::
              vector<const_google::protobuf::EnumDescriptor_*,_std::allocator<const_google::protobuf::EnumDescriptor_*>_>
              ::operator[](&local_78,(long)local_164);
    local_170 = *ppEVar8;
    in_stack_fffffffffffffd97 = 0;
    if (local_170 != (EnumDescriptor *)0x0) {
      in_stack_fffffffffffffd88 = EnumDescriptor::file(local_170);
      local_178 = in_stack_fffffffffffffd88;
      in_stack_fffffffffffffd80 =
           (Options *)
           std::
           unordered_set<const_google::protobuf::FileDescriptor_*,_std::hash<const_google::protobuf::FileDescriptor_*>,_std::equal_to<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
           ::count((unordered_set<const_google::protobuf::FileDescriptor_*,_std::hash<const_google::protobuf::FileDescriptor_*>,_std::equal_to<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                    *)in_stack_fffffffffffffd80,(key_type *)in_stack_fffffffffffffd78);
      in_stack_fffffffffffffd97 = in_stack_fffffffffffffd80 != (Options *)0x0 ^ 0xff;
    }
    if ((in_stack_fffffffffffffd97 & 1) != 0) {
      Namespace_abi_cxx11_((EnumDescriptor *)in_stack_fffffffffffffd88,in_stack_fffffffffffffd80);
      in_stack_fffffffffffffd78 =
           (Printer *)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::cpp::FileGenerator::ForwardDeclarations,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::cpp::FileGenerator::ForwardDeclarations>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::cpp::FileGenerator::ForwardDeclarations,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::cpp::FileGenerator::ForwardDeclarations>_>_>
                         *)this_00,
                        (key_type *)CONCAT17(in_stack_fffffffffffffdbf,in_stack_fffffffffffffdb8));
      ForwardDeclarations::AddEnum
                ((ForwardDeclarations *)in_stack_fffffffffffffdd0,(EnumDescriptor *)d_00);
      std::__cxx11::string::~string(local_198);
    }
    local_164 = local_164 + 1;
  }
  NamespaceOpener::NamespaceOpener
            ((NamespaceOpener *)in_stack_fffffffffffffd80,(Formatter *)in_stack_fffffffffffffd78);
  options = (Options *)local_128;
  local_1c8._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::cpp::FileGenerator::ForwardDeclarations,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::cpp::FileGenerator::ForwardDeclarations>_>_>
       ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::cpp::FileGenerator::ForwardDeclarations,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::cpp::FileGenerator::ForwardDeclarations>_>_>
                *)in_stack_fffffffffffffd78);
  local_1d0._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::cpp::FileGenerator::ForwardDeclarations,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::cpp::FileGenerator::ForwardDeclarations>_>_>
       ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::cpp::FileGenerator::ForwardDeclarations,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::cpp::FileGenerator::ForwardDeclarations>_>_>
              *)in_stack_fffffffffffffd78);
  while (bVar1 = std::operator!=(&local_1c8,&local_1d0), bVar1) {
    local_1d8 = std::
                _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::cpp::FileGenerator::ForwardDeclarations>_>
                ::operator*((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::cpp::FileGenerator::ForwardDeclarations>_>
                             *)0x4d1d32);
    NamespaceOpener::ChangeTo
              ((NamespaceOpener *)in_stack_fffffffffffffe10._M_node,in_stack_fffffffffffffe08);
    ForwardDeclarations::Print(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,options);
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::cpp::FileGenerator::ForwardDeclarations>_>
    ::operator++((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::cpp::FileGenerator::ForwardDeclarations>_>
                  *)in_stack_fffffffffffffd80);
  }
  NamespaceOpener::~NamespaceOpener(in_stack_fffffffffffffdb0);
  Formatter::operator()<>
            (this_00,(char *)CONCAT17(in_stack_fffffffffffffdbf,in_stack_fffffffffffffdb8));
  local_1e0 = local_128;
  local_1e8._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::cpp::FileGenerator::ForwardDeclarations,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::cpp::FileGenerator::ForwardDeclarations>_>_>
       ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::cpp::FileGenerator::ForwardDeclarations,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::cpp::FileGenerator::ForwardDeclarations>_>_>
                *)in_stack_fffffffffffffd78);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::cpp::FileGenerator::ForwardDeclarations,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::cpp::FileGenerator::ForwardDeclarations>_>_>
  ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::cpp::FileGenerator::ForwardDeclarations,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::cpp::FileGenerator::ForwardDeclarations>_>_>
         *)in_stack_fffffffffffffd78);
  while (bVar1 = std::operator!=(&local_1e8,(_Self *)&stack0xfffffffffffffe10), bVar1) {
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::cpp::FileGenerator::ForwardDeclarations>_>
    ::operator*((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::cpp::FileGenerator::ForwardDeclarations>_>
                 *)0x4d1e37);
    ForwardDeclarations::PrintTopLevelDecl
              (in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0);
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::cpp::FileGenerator::ForwardDeclarations>_>
    ::operator++((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::cpp::FileGenerator::ForwardDeclarations>_>
                  *)in_stack_fffffffffffffd80);
  }
  Formatter::operator()<>
            (this_00,(char *)CONCAT17(in_stack_fffffffffffffdbf,in_stack_fffffffffffffdb8));
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::cpp::FileGenerator::ForwardDeclarations,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::cpp::FileGenerator::ForwardDeclarations>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::cpp::FileGenerator::ForwardDeclarations,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::cpp::FileGenerator::ForwardDeclarations>_>_>
          *)0x4d1e9a);
  std::
  unordered_set<const_google::protobuf::FileDescriptor_*,_std::hash<const_google::protobuf::FileDescriptor_*>,_std::equal_to<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  ::~unordered_set((unordered_set<const_google::protobuf::FileDescriptor_*,_std::hash<const_google::protobuf::FileDescriptor_*>,_std::equal_to<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                    *)0x4d1ea7);
  std::
  vector<const_google::protobuf::EnumDescriptor_*,_std::allocator<const_google::protobuf::EnumDescriptor_*>_>
  ::~vector((vector<const_google::protobuf::EnumDescriptor_*,_std::allocator<const_google::protobuf::EnumDescriptor_*>_>
             *)CONCAT17(in_stack_fffffffffffffd97,in_stack_fffffffffffffd90));
  std::
  vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
  ::~vector((vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
             *)CONCAT17(in_stack_fffffffffffffd97,in_stack_fffffffffffffd90));
  Formatter::~Formatter((Formatter *)0x4d1ece);
  return;
}

Assistant:

void FileGenerator::GenerateForwardDeclarations(io::Printer* printer) {
  Formatter format(printer, variables_);
  std::vector<const Descriptor*> classes;
  std::vector<const EnumDescriptor*> enums;

  FlattenMessagesInFile(file_, &classes);  // All messages need forward decls.

  if (options_.proto_h) {  // proto.h needs extra forward declarations.
    // All classes / enums refered to as field members
    std::vector<const FieldDescriptor*> fields;
    ListAllFields(file_, &fields);
    for (int i = 0; i < fields.size(); i++) {
      classes.push_back(fields[i]->containing_type());
      classes.push_back(fields[i]->message_type());
      enums.push_back(fields[i]->enum_type());
    }
    ListAllTypesForServices(file_, &classes);
  }

  // Calculate the set of files whose definitions we get through include.
  // No need to forward declare types that are defined in these.
  std::unordered_set<const FileDescriptor*> public_set;
  PublicImportDFS(file_, &public_set);

  std::map<std::string, ForwardDeclarations> decls;
  for (int i = 0; i < classes.size(); i++) {
    const Descriptor* d = classes[i];
    if (d && !public_set.count(d->file()))
      decls[Namespace(d, options_)].AddMessage(d);
  }
  for (int i = 0; i < enums.size(); i++) {
    const EnumDescriptor* d = enums[i];
    if (d && !public_set.count(d->file()))
      decls[Namespace(d, options_)].AddEnum(d);
  }


  {
    NamespaceOpener ns(format);
    for (const auto& pair : decls) {
      ns.ChangeTo(pair.first);
      pair.second.Print(format, options_);
    }
  }
  format("PROTOBUF_NAMESPACE_OPEN\n");
  for (const auto& pair : decls) {
    pair.second.PrintTopLevelDecl(format, options_);
  }
  format("PROTOBUF_NAMESPACE_CLOSE\n");
}